

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O0

Type * slang::ast::PackedUnionType::fromSyntax
                 (Compilation *comp,StructUnionTypeSyntax *syntax,ASTContext *parentContext)

{
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  SourceLocation location;
  SourceLocation location_00;
  LookupLocation lookupLocation;
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  string_view arg;
  bool bVar1;
  bool bVar2;
  bitwidth_t bVar3;
  _If_is_unsigned_integer<unsigned_int> _Var4;
  reference ppSVar5;
  uint *puVar6;
  Diagnostic *pDVar7;
  Type *in_RDX;
  SyntaxNode *in_RSI;
  Compilation *in_RDI;
  Diagnostic *diag_3;
  Diagnostic *diag_2;
  Diagnostic *diag_1;
  Type *dimType;
  FieldSymbol *field;
  Token name;
  DeclaratorSyntax *decl;
  iterator __end3;
  iterator __begin3;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range3;
  Diagnostic *diag;
  Type *type;
  StructUnionMemberSyntax *member;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::StructUnionMemberSyntax> *__range2;
  ASTContext context;
  PackedUnionType *unionType;
  uint32_t fieldIndex;
  bool issuedError;
  bool isSoft;
  bool isTagged;
  bool isSigned;
  SyntaxNode *in_stack_000003e8;
  Scope *in_stack_000003f0;
  Type *typedefTarget;
  ValueSymbol *in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd98;
  uint in_stack_fffffffffffffd9c;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffda0;
  bitwidth_t in_stack_fffffffffffffda8;
  uint in_stack_fffffffffffffdac;
  uint uVar8;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  SourceLocation this;
  SourceLocation in_stack_fffffffffffffdb8;
  Compilation *in_stack_fffffffffffffdc0;
  FieldSymbol *in_stack_fffffffffffffdc8;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffdd0;
  Diagnostic *in_stack_fffffffffffffdd8;
  Compilation *diag_00;
  string_view local_1b0;
  bitwidth_t local_19c;
  SourceRange local_198;
  SourceRange local_188;
  undefined4 local_174;
  SourceLocation local_170;
  Type *local_168;
  int local_150;
  undefined4 local_14c;
  SourceLocation local_148;
  string_view local_140;
  FieldSymbol *local_130;
  Token local_128;
  DeclaratorSyntax *local_118;
  iterator local_110;
  iterator local_100;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *local_f0;
  SourceRange local_e8;
  Token local_d8;
  SourceLocation local_c8;
  undefined4 local_bc;
  Diagnostic *local_b8;
  Type *local_b0;
  StructUnionMemberSyntax *local_a8;
  StructUnionMemberSyntax **local_a0;
  __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
  local_98;
  SyntaxNode **local_90;
  char *local_88;
  undefined8 local_80;
  undefined8 local_78;
  SourceLocation local_38;
  PackedUnionType *local_30;
  int local_28;
  byte local_24;
  byte local_23;
  byte local_22;
  undefined1 local_21;
  Type *local_20;
  SyntaxNode *local_18;
  Compilation *local_10;
  Type *local_8;
  
  local_21 = (short)in_RSI[3].kind == LogicalEquivalenceExpression;
  local_22 = *(short *)&in_RSI[1].previewNode == 0x128;
  local_23 = *(short *)&in_RSI[1].previewNode == 0x118;
  local_24 = 0;
  local_28 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_38 = parsing::Token::location((Token *)(in_RSI + 1));
  typedefTarget = local_20;
  local_30 = BumpAllocator::
             emplace<slang::ast::PackedUnionType,slang::ast::Compilation&,bool_const&,bool_const&,bool_const&,slang::SourceLocation,slang::ast::ASTContext_const&>
                       (&in_stack_fffffffffffffdc0->super_BumpAllocator,
                        (Compilation *)in_stack_fffffffffffffdb8,
                        (bool *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                        (bool *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                        (bool *)in_stack_fffffffffffffda0.m_bits,
                        (SourceLocation *)
                        CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                        (ASTContext *)in_stack_fffffffffffffdd0._M_extent_value);
  Symbol::setSyntax((Symbol *)local_30,local_18);
  local_80 = LookupLocation::max;
  local_78 = DAT_00d8a540;
  local_88 = (local_20->super_Symbol).name._M_str;
  lookupLocation.scope._4_4_ = in_stack_fffffffffffffdac;
  lookupLocation.scope._0_4_ = in_stack_fffffffffffffda8;
  lookupLocation.index = in_stack_fffffffffffffdb0;
  lookupLocation._12_4_ = in_stack_fffffffffffffdb4;
  ASTContext::ASTContext
            ((ASTContext *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
             (Scope *)in_stack_fffffffffffffd90,lookupLocation,in_stack_fffffffffffffda0);
  local_90 = &local_18[4].parent;
  local_98._M_current =
       (StructUnionMemberSyntax **)
       std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>::begin
                 ((span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> *)
                  typedefTarget);
  local_a0 = (StructUnionMemberSyntax **)
             std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>::end
                       ((span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL> *)
                        CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  this._4_4_ = in_stack_fffffffffffffdb4;
  this._0_4_ = in_stack_fffffffffffffdb0;
  while (bVar1 = __gnu_cxx::
                 operator==<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                           ((__normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                             *)in_stack_fffffffffffffd90,
                            (__normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
                             *)typedefTarget), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppSVar5 = __gnu_cxx::
              __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
              ::operator*(&local_98);
    local_a8 = *ppSVar5;
    if ((local_a8->super_SyntaxNode).previewNode != (SyntaxNode *)0x0) {
      Scope::addMembers(in_stack_000003f0,in_stack_000003e8);
    }
    diag_00 = local_10;
    not_null<slang::syntax::DataTypeSyntax_*>::operator*
              ((not_null<slang::syntax::DataTypeSyntax_*> *)0x9f1b25);
    local_b0 = Compilation::getType
                         ((Compilation *)in_stack_fffffffffffffda0.m_bits,
                          (DataTypeSyntax *)
                          CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                          (ASTContext *)in_stack_fffffffffffffd90,typedefTarget);
    bVar1 = Type::isFourState((Type *)in_RDI);
    (local_30->super_IntegralType).isFourState =
         ((local_30->super_IntegralType).isFourState & 1U) != 0 || bVar1;
    bVar2 = Type::isError((Type *)0x9f1b84);
    bVar1 = (local_24 & 1) != 0;
    local_24 = bVar1 || bVar2;
    if (((!bVar1 && !bVar2) && (bVar1 = Type::isIntegral((Type *)in_stack_fffffffffffffd90), !bVar1)
        ) && (((local_22 & 1) == 0 || (bVar1 = Type::isVoid((Type *)0x9f1be0), !bVar1)))) {
      local_24 = 1;
      local_bc = 0x1c0009;
      not_null<slang::syntax::DataTypeSyntax_*>::operator->
                ((not_null<slang::syntax::DataTypeSyntax_*> *)0x9f1c0e);
      local_d8 = slang::syntax::SyntaxNode::getFirstToken((SyntaxNode *)in_stack_fffffffffffffdc0);
      local_c8 = parsing::Token::location(&local_d8);
      location._4_4_ = in_stack_fffffffffffffdac;
      location._0_4_ = in_stack_fffffffffffffda8;
      local_b8 = ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffda0.m_bits,this._4_4_,
                                     location);
      ast::operator<<((Diagnostic *)diag_00,(Type *)in_stack_fffffffffffffdd8);
      in_stack_fffffffffffffdd8 = local_b8;
      not_null<slang::syntax::DataTypeSyntax_*>::operator->
                ((not_null<slang::syntax::DataTypeSyntax_*> *)0x9f1c92);
      local_e8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)diag_00);
      range.startLoc._4_4_ = in_stack_fffffffffffffd9c;
      range.startLoc._0_4_ = in_stack_fffffffffffffd98;
      range.endLoc = (SourceLocation)in_stack_fffffffffffffda0.m_bits;
      Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffd90,range);
    }
    local_f0 = &local_a8->declarators;
    local_100 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::begin
                          ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)0x9f1ce5);
    local_110 = slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::end
                          ((SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *)
                           in_stack_fffffffffffffd90);
    while (bVar1 = operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                             ((self_type *)in_stack_fffffffffffffd90,
                              (iterator_base<slang::syntax::DeclaratorSyntax_*> *)typedefTarget),
          ((bVar1 ^ 0xffU) & 1) != 0) {
      local_118 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                  ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                               *)0x9f1d3f);
      local_128.kind = (local_118->name).kind;
      local_128._2_1_ = (local_118->name).field_0x2;
      local_128.numFlags.raw = (local_118->name).numFlags.raw;
      local_128.rawLen = (local_118->name).rawLen;
      local_128.info = (local_118->name).info;
      in_stack_fffffffffffffdc0 = local_10;
      local_140 = parsing::Token::valueText((Token *)in_stack_fffffffffffffda0.m_bits);
      local_148 = parsing::Token::location(&local_128);
      local_14c = 0;
      local_150 = local_28;
      local_28 = local_28 + 1;
      local_130 = BumpAllocator::
                  emplace<slang::ast::FieldSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,unsigned_int,unsigned_int>
                            (&in_stack_fffffffffffffdc0->super_BumpAllocator,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffffdb8,(SourceLocation *)this,
                             (uint *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8),
                             (uint *)in_stack_fffffffffffffda0.m_bits);
      ValueSymbol::setType(in_stack_fffffffffffffd90,typedefTarget);
      Symbol::setSyntax((Symbol *)local_130,&local_118->super_SyntaxNode);
      in_stack_fffffffffffffdc8 = local_130;
      in_stack_fffffffffffffdd0._M_extent_value =
           (size_t)not_null<const_slang::ast::Scope_*>::operator*
                             ((not_null<const_slang::ast::Scope_*> *)0x9f1e41);
      std::span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>::
      span<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>_&>
                ((span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                  *)in_stack_fffffffffffffda0.m_bits,
                 (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                 CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      syntax_00._M_extent._M_extent_value = in_stack_fffffffffffffdd0._M_extent_value;
      syntax_00._M_ptr = (pointer)in_stack_fffffffffffffdc8;
      Symbol::setAttributes
                ((Symbol *)in_stack_fffffffffffffdc0,(Scope *)in_stack_fffffffffffffdb8,syntax_00);
      Scope::addMember((Scope *)in_stack_fffffffffffffd90,&typedefTarget->super_Symbol);
      local_168 = Compilation::getType
                            ((Compilation *)in_stack_fffffffffffffda0.m_bits,
                             (Type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),
                             (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                             in_stack_fffffffffffffd90,(ASTContext *)typedefTarget);
      bVar1 = Type::isUnpackedArray(typedefTarget);
      uVar8 = in_stack_fffffffffffffdac;
      if ((bVar1) && ((local_24 & 1) == 0)) {
        local_174 = 0x1c0009;
        local_188 = parsing::Token::range((Token *)this);
        sourceRange.endLoc = in_stack_fffffffffffffdb8;
        sourceRange.startLoc = this;
        local_170 = (SourceLocation)
                    ASTContext::addDiag((ASTContext *)
                                        CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8
                                                ),SUB84((ulong)in_stack_fffffffffffffdc0 >> 0x20,0),
                                        sourceRange);
        ast::operator<<((Diagnostic *)diag_00,(Type *)in_stack_fffffffffffffdd8);
        in_stack_fffffffffffffdb8 = local_170;
        local_198 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)diag_00);
        range_00.startLoc._4_4_ = in_stack_fffffffffffffd9c;
        range_00.startLoc._0_4_ = in_stack_fffffffffffffd98;
        range_00.endLoc = (SourceLocation)in_stack_fffffffffffffda0.m_bits;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffd90,range_00);
        local_24 = 1;
        uVar8 = in_stack_fffffffffffffdac;
      }
      if ((local_30->super_IntegralType).bitWidth == 0) {
        bVar3 = Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffffd9c,
                                                   in_stack_fffffffffffffd98));
        (local_30->super_IntegralType).bitWidth = bVar3;
        in_stack_fffffffffffffdac = uVar8;
      }
      else if (((local_22 & 1) == 0) && ((local_23 & 1) == 0)) {
        in_stack_fffffffffffffda8 = (local_30->super_IntegralType).bitWidth;
        bVar3 = Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffffd9c,
                                                   in_stack_fffffffffffffd98));
        in_stack_fffffffffffffdac = uVar8 & 0xffffff;
        if ((in_stack_fffffffffffffda8 != bVar3) &&
           (in_stack_fffffffffffffdac = uVar8 & 0xffffff, (local_24 & 1) == 0)) {
          local_1b0 = parsing::Token::valueText((Token *)in_stack_fffffffffffffda0.m_bits);
          bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_1b0);
          in_stack_fffffffffffffdac = CONCAT13(bVar1,(int3)in_stack_fffffffffffffdac) ^ 0xff000000;
        }
        if ((in_stack_fffffffffffffdac & 0x1000000) != 0) {
          parsing::Token::range((Token *)this);
          sourceRange_00.endLoc = in_stack_fffffffffffffdb8;
          sourceRange_00.startLoc = this;
          pDVar7 = ASTContext::addDiag((ASTContext *)
                                       CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8)
                                       ,SUB84((ulong)in_stack_fffffffffffffdc0 >> 0x20,0),
                                       sourceRange_00);
          in_stack_fffffffffffffd98 = SUB84(pDVar7,0);
          in_stack_fffffffffffffd9c = (uint)((ulong)pDVar7 >> 0x20);
          parsing::Token::valueText((Token *)in_stack_fffffffffffffda0.m_bits);
          arg._M_str = (char *)diag_00;
          arg._M_len = (size_t)in_stack_fffffffffffffdd8;
          in_stack_fffffffffffffda0.m_bits =
               (underlying_type)
               Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffdd0._M_extent_value,arg);
          Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          Diagnostic::operator<<<unsigned_int>
                    ((Diagnostic *)in_stack_fffffffffffffda0.m_bits,in_stack_fffffffffffffd9c);
          Diagnostic::operator<<<unsigned_int>
                    ((Diagnostic *)in_stack_fffffffffffffda0.m_bits,in_stack_fffffffffffffd9c);
          local_24 = 1;
        }
      }
      else {
        this = (SourceLocation)&(local_30->super_IntegralType).bitWidth;
        local_19c = Type::getBitWidth((Type *)CONCAT44(in_stack_fffffffffffffd9c,
                                                       in_stack_fffffffffffffd98));
        puVar6 = std::max<unsigned_int>((uint *)this,&local_19c);
        (local_30->super_IntegralType).bitWidth = *puVar6;
        in_stack_fffffffffffffdac = uVar8;
      }
      if (local_118->initializer != (EqualsValueClauseSyntax *)0x0) {
        parsing::Token::location(&local_118->initializer->equals);
        location_00._4_4_ = in_stack_fffffffffffffdac;
        location_00._0_4_ = in_stack_fffffffffffffda8;
        in_stack_fffffffffffffd90 =
             (ValueSymbol *)
             ASTContext::addDiag((ASTContext *)in_stack_fffffffffffffda0.m_bits,this._4_4_,
                                 location_00);
        not_null<slang::syntax::ExpressionSyntax_*>::operator->
                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0x9f220c);
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)diag_00);
        range_01.startLoc._4_4_ = in_stack_fffffffffffffd9c;
        range_01.startLoc._0_4_ = in_stack_fffffffffffffd98;
        range_01.endLoc = (SourceLocation)in_stack_fffffffffffffda0.m_bits;
        Diagnostic::operator<<((Diagnostic *)in_stack_fffffffffffffd90,range_01);
      }
      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
      ::
      operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>_>
                ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::iterator_base<slang::syntax::DeclaratorSyntax_*>,_false>
                  *)in_stack_fffffffffffffd90);
    }
    __gnu_cxx::
    __normal_iterator<slang::syntax::StructUnionMemberSyntax_**,_std::span<slang::syntax::StructUnionMemberSyntax_*,_18446744073709551615UL>_>
    ::operator++(&local_98);
  }
  if (((local_22 & 1) != 0) && (local_28 != 0)) {
    _Var4 = std::bit_width<unsigned_int>(0);
    local_30->tagBits = _Var4;
    (local_30->super_IntegralType).bitWidth =
         local_30->tagBits + (local_30->super_IntegralType).bitWidth;
  }
  if (((local_30->super_IntegralType).bitWidth == 0) || ((local_24 & 1) != 0)) {
    local_8 = Compilation::getErrorType(local_10);
  }
  else {
    local_8 = anon_unknown.dwarf_14f726c::createPackedDims
                        ((ASTContext *)in_stack_fffffffffffffdd0._M_extent_value,
                         (Type *)in_stack_fffffffffffffdc8,
                         (SyntaxList<slang::syntax::VariableDimensionSyntax> *)
                         in_stack_fffffffffffffdc0);
  }
  return local_8;
}

Assistant:

const Type& PackedUnionType::fromSyntax(Compilation& comp, const StructUnionTypeSyntax& syntax,
                                        const ASTContext& parentContext) {
    const bool isSigned = syntax.signing.kind == TokenKind::SignedKeyword;
    const bool isTagged = syntax.taggedOrSoft.kind == TokenKind::TaggedKeyword;
    const bool isSoft = syntax.taggedOrSoft.kind == TokenKind::SoftKeyword;
    bool issuedError = false;
    uint32_t fieldIndex = 0;

    auto unionType = comp.emplace<PackedUnionType>(comp, isSigned, isTagged, isSoft,
                                                   syntax.keyword.location(), parentContext);
    unionType->setSyntax(syntax);

    ASTContext context(*unionType, LookupLocation::max, parentContext.flags);

    for (auto member : syntax.members) {
        if (member->previewNode)
            unionType->addMembers(*member->previewNode);

        const Type& type = comp.getType(*member->type, context);
        unionType->isFourState |= type.isFourState();
        issuedError |= type.isError();

        if (!issuedError && !type.isIntegral() && (!isTagged || !type.isVoid())) {
            issuedError = true;
            auto& diag = context.addDiag(diag::PackedMemberNotIntegral,
                                         member->type->getFirstToken().location());
            diag << type;
            diag << member->type->sourceRange();
        }

        for (auto decl : member->declarators) {
            auto name = decl->name;
            auto field = comp.emplace<FieldSymbol>(name.valueText(), name.location(), 0u,
                                                   fieldIndex++);
            field->setType(type);
            field->setSyntax(*decl);
            field->setAttributes(*context.scope, member->attributes);
            unionType->addMember(*field);

            // Unpacked arrays are disallowed in packed unions.
            if (const Type& dimType = comp.getType(type, decl->dimensions, context);
                dimType.isUnpackedArray() && !issuedError) {

                auto& diag = context.addDiag(diag::PackedMemberNotIntegral, decl->name.range());
                diag << dimType;
                diag << decl->dimensions.sourceRange();
                issuedError = true;
            }

            if (!unionType->bitWidth) {
                unionType->bitWidth = type.getBitWidth();
            }
            else if (isTagged || isSoft) {
                // In tagged unions the members don't all have to have the same width.
                unionType->bitWidth = std::max(unionType->bitWidth, type.getBitWidth());
            }
            else if (unionType->bitWidth != type.getBitWidth() && !issuedError &&
                     !name.valueText().empty()) {
                auto& diag = context.addDiag(diag::PackedUnionWidthMismatch, name.range());
                diag << name.valueText() << type.getBitWidth() << unionType->bitWidth;
                issuedError = true;
            }

            if (decl->initializer) {
                auto& diag = context.addDiag(diag::PackedMemberHasInitializer,
                                             decl->initializer->equals.location());
                diag << decl->initializer->expr->sourceRange();
            }
        }
    }

    // In tagged unions the tag contributes to the total number of packed bits.
    if (isTagged && fieldIndex) {
        unionType->tagBits = (uint32_t)std::bit_width(fieldIndex - 1);
        unionType->bitWidth += unionType->tagBits;
    }

    if (!unionType->bitWidth || issuedError)
        return comp.getErrorType();

    return createPackedDims(context, unionType, syntax.dimensions);
}